

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::SubroutineUniform::SubroutineUniform
          (SubroutineUniform *this,UniformValueGenerator *generator,
          SubroutineFunctionSet *_functions,Loc _location,int _arraySize,DefOccurence _defOccurence,
          bool _used)

{
  int iVar1;
  reference pvVar2;
  size_type sVar3;
  undefined8 uVar4;
  int local_25c;
  undefined1 local_258 [4];
  int i;
  UniformValue local_1c8;
  UniformType local_e0;
  byte local_4d;
  int local_4c;
  bool _used_local;
  SubroutineFunctionSet *pSStack_48;
  int _arraySize_local;
  SubroutineFunctionSet *_functions_local;
  UniformValueGenerator *generator_local;
  SubroutineUniform *this_local;
  undefined8 uStack_28;
  DefOccurence _defOccurence_local;
  Loc _location_local;
  
  uVar4 = _location.super_LayoutSpecifierBase._0_8_;
  this_local._4_4_ = _defOccurence.occurence;
  local_4d = _used;
  local_4c = _arraySize;
  pSStack_48 = _functions;
  _functions_local = (SubroutineFunctionSet *)generator;
  generator_local = (UniformValueGenerator *)this;
  uStack_28 = uVar4;
  SubroutineFunctionSet::SubroutineFunctionSet(&this->functions,_functions);
  (this->location).super_LayoutSpecifierBase.occurence.occurence =
       _location.super_LayoutSpecifierBase.occurence.occurence.occurence;
  (this->location).super_LayoutSpecifierBase.val = (int)uVar4;
  (this->location).super_LayoutSpecifierBase.numSys = (int)((ulong)uVar4 >> 0x20);
  this->arraySize = local_4c;
  (this->defOccurence).occurence = this_local._4_4_;
  this->used = (bool)(local_4d & 1);
  std::vector<int,_std::allocator<int>_>::vector(&this->arraySizesSegmented);
  UniformType::UniformType(&local_e0,0x1405,0);
  UniformValue::UniformValue
            (&this->embeddedUIntUniform,&local_e0,(UniformValueGenerator *)_functions_local);
  UniformType::~UniformType(&local_e0);
  std::__cxx11::string::string((string *)&this->name);
  if (-1 < this->arraySize) {
    if (this->arraySize == 0) {
      this->arraySize = 1;
      this->isArray = false;
    }
    else {
      this->isArray = true;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->arraySizesSegmented,&this->arraySize);
    UniformType::UniformType((UniformType *)local_258,0x1405,this->arraySize);
    UniformValue::UniformValue
              (&local_1c8,(UniformType *)local_258,(UniformValueGenerator *)_functions_local);
    UniformValue::operator=(&this->embeddedUIntUniform,&local_1c8);
    UniformValue::~UniformValue(&local_1c8);
    UniformType::~UniformType((UniformType *)local_258);
    for (local_25c = 0; local_25c < this->arraySize; local_25c = local_25c + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(this->embeddedUIntUniform).uValues,(long)local_25c);
      iVar1 = *pvVar2;
      sVar3 = std::
              vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
              ::size((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                      *)this);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(this->embeddedUIntUniform).uValues,(long)local_25c);
      *pvVar2 = (value_type)((ulong)(long)iVar1 % sVar3);
    }
    return;
  }
  __assert_fail("arraySize >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x32a,
                "glcts::(anonymous namespace)::SubroutineUniform::SubroutineUniform(UniformValueGenerator &, SubroutineFunctionSet &, Loc, int, DefOccurence, bool)"
               );
}

Assistant:

SubroutineUniform(UniformValueGenerator& generator, SubroutineFunctionSet& _functions, Loc _location,
					  int _arraySize = 0, DefOccurence _defOccurence = DefOccurence::ALL_SH, bool _used = true)
		: functions(_functions)
		, location(_location)
		, arraySize(_arraySize)
		, defOccurence(_defOccurence)
		, used(_used)
		, embeddedUIntUniform(GL_UNSIGNED_INT, generator)
	{

		assert(arraySize >= 0);

		if (!arraySize)
		{
			arraySize = 1;
			isArray   = false;
		}
		else
		{
			isArray = true;
		}

		arraySizesSegmented.push_back(arraySize);

		embeddedUIntUniform = UniformValue(UniformType(GL_UNSIGNED_INT, arraySize), generator);
		for (int i = 0; i < arraySize; i++)
		{
			embeddedUIntUniform.uValues[i] = static_cast<GLint>(embeddedUIntUniform.uValues[i] % functions.fn.size());
		}
	}